

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O3

uint64_t __thiscall leveldb::Table::ApproximateOffsetOf(Table *this,Slice *key)

{
  int iVar1;
  Iterator *pIVar2;
  undefined4 extraout_var;
  uint64_t uVar3;
  BlockHandle handle;
  Status s;
  Slice input;
  Slice local_48;
  BlockHandle local_38;
  
  pIVar2 = Block::NewIterator(this->rep_->index_block,(this->rep_->options).comparator);
  (*pIVar2->_vptr_Iterator[5])(pIVar2,key);
  iVar1 = (*pIVar2->_vptr_Iterator[2])(pIVar2);
  if ((char)iVar1 == '\0') {
    uVar3 = (this->rep_->metaindex_handle).offset_;
  }
  else {
    local_48.data_._0_4_ = 0xffffffff;
    local_48.data_._4_4_ = 0xffffffff;
    local_48.size_._0_4_ = 0xffffffff;
    local_48.size_._4_4_ = 0xffffffff;
    iVar1 = (*pIVar2->_vptr_Iterator[9])(pIVar2);
    local_38.size_ = CONCAT44(extraout_var,iVar1);
    BlockHandle::DecodeFrom(&local_38,&local_48);
    if ((void *)local_38.offset_ == (void *)0x0) {
      uVar3 = CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_);
    }
    else {
      uVar3 = (this->rep_->metaindex_handle).offset_;
      operator_delete__((void *)local_38.offset_);
    }
  }
  (*pIVar2->_vptr_Iterator[1])(pIVar2);
  return uVar3;
}

Assistant:

uint64_t Table::ApproximateOffsetOf(const Slice& key) const {
  Iterator* index_iter =
      rep_->index_block->NewIterator(rep_->options.comparator);
  index_iter->Seek(key);
  uint64_t result;
  if (index_iter->Valid()) {
    BlockHandle handle;
    Slice input = index_iter->value();
    Status s = handle.DecodeFrom(&input);
    if (s.ok()) {
      result = handle.offset();
    } else {
      // Strange: we can't decode the block handle in the index block.
      // We'll just return the offset of the metaindex block, which is
      // close to the whole file size for this case.
      result = rep_->metaindex_handle.offset();
    }
  } else {
    // key is past the last key in the file.  Approximate the offset
    // by returning the offset of the metaindex block (which is
    // right near the end of the file).
    result = rep_->metaindex_handle.offset();
  }
  delete index_iter;
  return result;
}